

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::~IfcElementAssembly(IfcElementAssembly *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x83c488;
  *(undefined8 *)&this->field_0x190 = 0x83c578;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x83c4b0;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x83c4d8;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x83c500;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x83c528;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x83c550;
  pcVar2 = (this->PredefinedType)._M_dataplus._M_p;
  paVar1 = &(this->PredefinedType).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcElement).field_0x148;
  if (puVar3 != &this->field_0x158) {
    operator_delete(puVar3,*(long *)&this->field_0x158 + 1);
  }
  IfcElement::~IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__0083c590);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}